

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populate
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  bool bVar1;
  logic_error *this_00;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_68;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> local_50;
  undefined1 local_35;
  ConfigData *local_28;
  ConfigData *config_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens_local;
  CommandLine<Catch::ConfigData> *this_local;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *unusedTokens;
  
  local_28 = config;
  config_local = (ConfigData *)tokens;
  tokens_local = (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this;
  this_local = (CommandLine<Catch::ConfigData> *)__return_storage_ptr__;
  bVar1 = std::
          vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
          ::empty(&this->m_options);
  if ((bVar1) &&
     (bVar1 = std::
              map<int,_Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
              ::empty(&this->m_positionalArgs), bVar1)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No options or arguments specified");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_35 = 0;
  populateOptions(__return_storage_ptr__,this,
                  (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)
                  config_local,local_28);
  populateFixedArgs(&local_50,this,__return_storage_ptr__,local_28);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            (__return_storage_ptr__,&local_50);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&local_50);
  populateFloatingArgs(&local_68,this,__return_storage_ptr__,local_28);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::operator=
            (__return_storage_ptr__,&local_68);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populate( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( m_options.empty() && m_positionalArgs.empty() )
                throw std::logic_error( "No options or arguments specified" );

            std::vector<Parser::Token> unusedTokens = populateOptions( tokens, config );
            unusedTokens = populateFixedArgs( unusedTokens, config );
            unusedTokens = populateFloatingArgs( unusedTokens, config );
            return unusedTokens;
        }